

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void WriteVars(FILE *file,SDWORD *vars,size_t count,DWORD id)

{
  ulong uVar1;
  ulong uVar2;
  DWORD var;
  FPNGChunkArchive arc;
  DWORD local_32c;
  FPNGChunkArchive local_328;
  
  uVar1 = 0;
  while( true ) {
    if (count == uVar1) {
      return;
    }
    if (vars[uVar1] != 0) break;
    uVar1 = uVar1 + 1;
  }
  do {
    count = count - 1;
    uVar2 = uVar1;
    if (count <= uVar1) break;
    uVar2 = count;
  } while (vars[count] == 0);
  FPNGChunkArchive::FPNGChunkArchive(&local_328,file,id);
  for (uVar1 = 0; uVar1 <= uVar2; uVar1 = uVar1 + 1) {
    local_32c = vars[uVar1];
    FArchive::operator<<(&local_328.super_FArchive,&local_32c);
  }
  FPNGChunkArchive::~FPNGChunkArchive(&local_328);
  return;
}

Assistant:

static void WriteVars (FILE *file, SDWORD *vars, size_t count, DWORD id)
{
	size_t i, j;

	for (i = 0; i < count; ++i)
	{
		if (vars[i] != 0)
			break;
	}
	if (i < count)
	{
		// Find last non-zero var. Anything beyond the last stored variable
		// will be zeroed at load time.
		for (j = count-1; j > i; --j)
		{
			if (vars[j] != 0)
				break;
		}
		FPNGChunkArchive arc (file, id);
		for (i = 0; i <= j; ++i)
		{
			DWORD var = vars[i];
			arc << var;
		}
	}
}